

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O2

Am_Edit_Translation_Table Am_Edit_Translation_Table::Default_Table(void)

{
  Am_Edit_Translation_Table_Data *in_RDI;
  Am_Input_Char local_60;
  Am_Input_Char local_5c;
  Am_Input_Char local_58;
  Am_Input_Char local_54;
  Am_Input_Char local_50;
  Am_Input_Char local_4c;
  Am_Input_Char local_48;
  Am_Input_Char local_44;
  Am_Input_Char local_40;
  Am_Input_Char local_3c;
  Am_Input_Char local_38;
  Am_Input_Char local_34;
  Am_Input_Char local_30;
  Am_Input_Char local_2c;
  Am_Input_Char local_28;
  Am_Input_Char local_24;
  Am_Input_Char local_20;
  Am_Input_Char local_1c;
  Am_Input_Char local_18;
  Am_Input_Char local_14;
  
  Am_Edit_Translation_Table((Am_Edit_Translation_Table *)in_RDI);
  Am_Input_Char::Am_Input_Char(&local_14,"RIGHT_ARROW",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_14,Am_Move_Cursor_Right);
  Am_Input_Char::Am_Input_Char(&local_18,"LEFT_ARROW",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_18,Am_Move_Cursor_Left);
  Am_Input_Char::Am_Input_Char(&local_1c,"CONTROL_f",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_1c,Am_Move_Cursor_Right);
  Am_Input_Char::Am_Input_Char(&local_20,"CONTROL_b",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_20,Am_Move_Cursor_Left);
  Am_Input_Char::Am_Input_Char(&local_24,"CONTROL_a",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_24,Am_Move_Cursor_To_Start);
  Am_Input_Char::Am_Input_Char(&local_28,"HOME",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_28,Am_Move_Cursor_To_Start);
  Am_Input_Char::Am_Input_Char(&local_2c,"CONTROL_e",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_2c,Am_Move_Cursor_To_End);
  Am_Input_Char::Am_Input_Char(&local_30,"END",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_30,Am_Move_Cursor_To_End);
  Am_Input_Char::Am_Input_Char(&local_34,"CONTROL_h",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_34,Am_Delete_Char_Before_Cursor);
  Am_Input_Char::Am_Input_Char(&local_38,"BACKSPACE",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_38,Am_Delete_Char_Before_Cursor);
  Am_Input_Char::Am_Input_Char(&local_3c,"CONTROL_d",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_3c,Am_Delete_Char_After_Cursor);
  Am_Input_Char::Am_Input_Char(&local_40,"CONTROL_k",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_40,Am_Kill_From_Cursor);
  Am_Input_Char::Am_Input_Char(&local_44,"CONTROL_u",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_44,Am_Delete_Entire_String);
  Am_Input_Char::Am_Input_Char(&local_48,"CONTROL_w",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_48,Am_Delete_Word_Before_Cursor);
  Am_Input_Char::Am_Input_Char(&local_4c,"CONTROL_BACKSPACE",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_4c,Am_Delete_Word_Before_Cursor);
  Am_Input_Char::Am_Input_Char(&local_50,"CONTROL_c",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_50,Am_Set_Cut_Buffer_From_Text);
  Am_Input_Char::Am_Input_Char(&local_54,"MIDDLE_DOWN",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_54,Am_Insert_Cut_Buffer_At_Cursor);
  Am_Input_Char::Am_Input_Char(&local_58,"DELETE",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_58,Am_Delete_Char_Before_Cursor);
  Am_Input_Char::Am_Input_Char(&local_5c,"CONTROL_DELETE",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_5c,Am_Delete_Word_After_Cursor);
  Am_Input_Char::Am_Input_Char(&local_60,"CONTROL_y",true);
  Add((Am_Edit_Translation_Table *)in_RDI,local_60,Am_Insert_Cut_Buffer_At_Cursor);
  return (Am_Edit_Translation_Table)in_RDI;
}

Assistant:

Am_Edit_Translation_Table
Am_Edit_Translation_Table::Default_Table()
{
  Am_Edit_Translation_Table table;
  table.Add("RIGHT_ARROW", Am_Move_Cursor_Right);
  table.Add("LEFT_ARROW", Am_Move_Cursor_Left);
  table.Add("CONTROL_f", Am_Move_Cursor_Right);
  table.Add("CONTROL_b", Am_Move_Cursor_Left);
  table.Add("CONTROL_a", Am_Move_Cursor_To_Start);
  table.Add("HOME", Am_Move_Cursor_To_Start);
  table.Add("CONTROL_e", Am_Move_Cursor_To_End);
  table.Add("END", Am_Move_Cursor_To_End);
  table.Add("CONTROL_h", Am_Delete_Char_Before_Cursor);
  table.Add("BACKSPACE", Am_Delete_Char_Before_Cursor);
  table.Add("CONTROL_d", Am_Delete_Char_After_Cursor);
  table.Add("CONTROL_k", Am_Kill_From_Cursor);
  table.Add("CONTROL_u", Am_Delete_Entire_String);
  table.Add("CONTROL_w", Am_Delete_Word_Before_Cursor);
  table.Add("CONTROL_BACKSPACE", Am_Delete_Word_Before_Cursor);
  table.Add("CONTROL_c", Am_Set_Cut_Buffer_From_Text);
  table.Add("MIDDLE_DOWN", Am_Insert_Cut_Buffer_At_Cursor);
#ifdef WIN_KEYBINDINGS
  table.Add("DELETE", Am_Delete_Char_After_Cursor);
  //  table.Add ("CONTROL_DELETE",   Am_Delete_Word_After_Cursor);
  table.Add("CONTROL_v", Am_Insert_Cut_Buffer_At_Cursor);
  table.Add("CONTROL_y", Am_Delete_Entire_String);
#else
  table.Add("DELETE", Am_Delete_Char_Before_Cursor);
  table.Add("CONTROL_DELETE", Am_Delete_Word_After_Cursor);
  table.Add("CONTROL_y", Am_Insert_Cut_Buffer_At_Cursor);
#endif
  return table;
}